

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O2

size_t count_encoded_length(size_t n,size_t prefix)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  
  uVar1 = (ulong)(uint)~(-1 << ((byte)prefix & 0x1f));
  uVar3 = n - uVar1;
  if (n < uVar1) {
    sVar2 = 1;
  }
  else {
    sVar2 = 2;
    for (; 0x7f < uVar3; uVar3 = uVar3 >> 7) {
      sVar2 = sVar2 + 1;
    }
  }
  return sVar2;
}

Assistant:

static size_t count_encoded_length(size_t n, size_t prefix) {
  size_t k = (size_t)((1 << prefix) - 1);
  size_t len = 0;

  if (n < k) {
    return 1;
  }

  n -= k;
  ++len;

  for (; n >= 128; n >>= 7, ++len)
    ;

  return len + 1;
}